

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O0

void ssh_socket_log(Plug *plug,PlugLogType type,SockAddr *addr,int port,char *error_msg,
                   int error_code)

{
  Ssh *ssh;
  int error_code_local;
  char *error_msg_local;
  int port_local;
  SockAddr *addr_local;
  PlugLogType type_local;
  Plug *plug_local;
  
  if (((ulong)plug[0xb].vt & 1) == 0) {
    backend_socket_log((Seat *)plug[-4].vt,(LogContext *)plug[7].vt,type,addr,port,error_msg,
                       error_code,(Conf *)plug[-3].vt,(_Bool)(*(byte *)&plug[0x37].vt & 1));
  }
  return;
}

Assistant:

static void ssh_socket_log(Plug *plug, PlugLogType type, SockAddr *addr,
                           int port, const char *error_msg, int error_code)
{
    Ssh *ssh = container_of(plug, Ssh, plug);

    /*
     * While we're attempting connection sharing, don't loudly log
     * everything that happens. Real TCP connections need to be logged
     * when we _start_ trying to connect, because it might be ages
     * before they respond if something goes wrong; but connection
     * sharing is local and quick to respond, and it's sufficient to
     * simply wait and see whether it worked afterwards.
     */

    if (!ssh->attempting_connshare)
        backend_socket_log(ssh->seat, ssh->logctx, type, addr, port,
                           error_msg, error_code, ssh->conf,
                           ssh->session_started);
}